

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O1

double AccumulateLSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint8_t *puVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (h < 1) {
    dVar13 = 0.0;
  }
  else {
    dVar13 = 0.0;
    uVar6 = 0;
    do {
      iVar2 = (int)uVar6;
      uVar3 = 2;
      if (2 < iVar2) {
        uVar3 = uVar6 & 0xffffffff;
      }
      if (0 < w) {
        iVar1 = iVar2 + 3;
        if (h <= iVar2 + 3) {
          iVar1 = h;
        }
        iVar12 = 2;
        if (2 < iVar2) {
          iVar12 = iVar2;
        }
        uVar4 = 0;
        do {
          iVar2 = (int)uVar4;
          uVar10 = 2;
          if (2 < iVar2) {
            uVar10 = uVar4 & 0xffffffff;
          }
          dVar14 = 65025.0;
          if (iVar12 + -2 < iVar1) {
            iVar8 = iVar2 + 3;
            if (w <= iVar2 + 3) {
              iVar8 = w;
            }
            iVar9 = 2;
            if (2 < iVar2) {
              iVar9 = iVar2;
            }
            dVar14 = 65025.0;
            lVar7 = uVar3 - 2;
            puVar11 = src + (long)src_stride * (uVar3 - 2);
            do {
              lVar5 = uVar10 - 2;
              dVar15 = dVar14;
              if (iVar9 + -2 < iVar8) {
                do {
                  dVar14 = ((double)puVar11[lVar5] - (double)ref[uVar4 + uVar6 * (long)ref_stride])
                           * ((double)puVar11[lVar5] - (double)ref[uVar4 + uVar6 * (long)ref_stride]
                             );
                  if (dVar15 <= dVar14) {
                    dVar14 = dVar15;
                  }
                  lVar5 = lVar5 + 1;
                  dVar15 = dVar14;
                } while (lVar5 < iVar8);
              }
              lVar7 = lVar7 + 1;
              puVar11 = puVar11 + src_stride;
            } while (lVar7 < iVar1);
          }
          dVar13 = dVar13 + dVar14;
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)w);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)h);
  }
  return dVar13;
}

Assistant:

static double AccumulateLSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  int x, y;
  double total_sse = 0.;
  for (y = 0; y < h; ++y) {
    const int y_0 = (y - RADIUS < 0) ? 0 : y - RADIUS;
    const int y_1 = (y + RADIUS + 1 >= h) ? h : y + RADIUS + 1;
    for (x = 0; x < w; ++x) {
      const int x_0 = (x - RADIUS < 0) ? 0 : x - RADIUS;
      const int x_1 = (x + RADIUS + 1 >= w) ? w : x + RADIUS + 1;
      double best_sse = 255. * 255.;
      const double value = (double)ref[y * ref_stride + x];
      int i, j;
      for (j = y_0; j < y_1; ++j) {
        const uint8_t* const s = src + j * src_stride;
        for (i = x_0; i < x_1; ++i) {
          const double diff = s[i] - value;
          const double sse = diff * diff;
          if (sse < best_sse) best_sse = sse;
        }
      }
      total_sse += best_sse;
    }
  }
  return total_sse;
}